

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall Units_removeUnit_Test::TestBody(Units_removeUnit_Test *this)

{
  string *psVar1;
  char cVar2;
  string sVar3;
  char *pcVar4;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  UnitsPtr u;
  AssertHelper local_a0 [8];
  AssertionResult local_98;
  long local_88 [2];
  long *local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  libcellml::Units::create();
  psVar1 = local_38;
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"micro","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78);
  libcellml::Units::addUnit((StandardUnit)psVar1,(string *)0x0,1.0,1.0,(string *)&local_98);
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_38;
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"kelvin","");
  libcellml::Units::addUnit(psVar1);
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_38;
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"siemens","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"milli","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  libcellml::Units::addUnit(psVar1,(string *)&local_98,-1.0,1.0,(string *)&local_78);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  psVar1 = local_38;
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"metre","");
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"1.7e10","");
  pcVar4 = "";
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"","");
  libcellml::Units::addUnit(psVar1,(string *)&local_98,1.0,1.0,(string *)&local_78);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  local_78 = (long *)&DAT_00000004;
  local_58[0] = (long *)libcellml::Units::unitCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(4)","u->unitCount()",(unsigned_long *)&local_78,
             (unsigned_long *)local_58);
  if ((string)local_98.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_98.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = ((local_98.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x36b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_78 != (long *)0x0)) {
      (**(code **)(*local_78 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  psVar1 = local_38;
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"siemens","");
  cVar2 = libcellml::Units::removeUnit(psVar1);
  local_78 = (long *)CONCAT71(local_78._1_7_,cVar2);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_98._0_8_ == local_88) {
    if (cVar2 == '\0') goto LAB_0012c0ea;
  }
  else {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    if (((ulong)local_78 & 1) == 0) {
LAB_0012c0ea:
      testing::Message::Message((Message *)local_58);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_98,(char *)&local_78,"u->removeUnit(\"siemens\")","false");
      testing::internal::AssertHelper::AssertHelper
                (local_a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                 ,0x36c,(char *)local_98._0_8_);
      testing::internal::AssertHelper::operator=(local_a0,(Message *)local_58);
      testing::internal::AssertHelper::~AssertHelper(local_a0);
      if ((long *)local_98._0_8_ != local_88) {
        operator_delete((void *)local_98._0_8_,local_88[0] + 1);
      }
      if (((local_58[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0'))
         && (local_58[0] != (long *)0x0)) {
        (**(code **)(*local_58[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar3 = (string)libcellml::Units::removeUnit((StandardUnit)local_38);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_78._0_1_ = sVar3;
  if (sVar3 == (string)0x0) {
    testing::Message::Message((Message *)local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(char *)&local_78,"u->removeUnit(libcellml::Units::StandardUnit::KELVIN)",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x36d,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    }
    if (((local_58[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0'))
       && (local_58[0] != (long *)0x0)) {
      (**(code **)(*local_58[0] + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar2 = libcellml::Units::removeUnit((ulong)local_38);
  local_78 = (long *)CONCAT71(local_78._1_7_,cVar2);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(char *)&local_78,"u->removeUnit(1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x36e,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    }
    if (((local_58[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0'))
       && (local_58[0] != (long *)0x0)) {
      (**(code **)(*local_58[0] + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78 = (long *)0x1;
  local_58[0] = (long *)libcellml::Units::unitCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(1)","u->unitCount()",(unsigned_long *)&local_78,
             (unsigned_long *)local_58);
  if ((string)local_98.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_98.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_98.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x36f,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_78 != (long *)0x0)) {
      (**(code **)(*local_78 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  psVar1 = local_38;
  local_98._0_8_ = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"gram","");
  cVar2 = libcellml::Units::removeUnit(psVar1);
  local_78 = (long *)(CONCAT71(local_78._1_7_,cVar2) ^ 1);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_98._0_8_ == local_88) {
    if (cVar2 == '\0') goto LAB_0012c515;
  }
  else {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    if (((ulong)local_78 & 1) != 0) goto LAB_0012c515;
  }
  testing::Message::Message((Message *)local_58);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_98,(char *)&local_78,"u->removeUnit(\"gram\")","true");
  testing::internal::AssertHelper::AssertHelper
            (local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
             ,0x372,(char *)local_98._0_8_);
  testing::internal::AssertHelper::operator=(local_a0,(Message *)local_58);
  testing::internal::AssertHelper::~AssertHelper(local_a0);
  if ((long *)local_98._0_8_ != local_88) {
    operator_delete((void *)local_98._0_8_,local_88[0] + 1);
  }
  if (((local_58[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_58[0] != (long *)0x0)) {
    (**(code **)(*local_58[0] + 8))();
  }
LAB_0012c515:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar2 = libcellml::Units::removeUnit((StandardUnit)local_38);
  local_78 = (long *)(CONCAT71(local_78._1_7_,cVar2) ^ 1);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(char *)&local_78,
               "u->removeUnit(libcellml::Units::StandardUnit::BECQUEREL)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x373,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    }
    if (((local_58[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0'))
       && (local_58[0] != (long *)0x0)) {
      (**(code **)(*local_58[0] + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar2 = libcellml::Units::removeUnit((ulong)local_38);
  local_78 = (long *)(CONCAT71(local_78._1_7_,cVar2) ^ 1);
  local_70.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar2 != '\0') {
    testing::Message::Message((Message *)local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(char *)&local_78,"u->removeUnit(3)","true");
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x374,(char *)local_98._0_8_);
    testing::internal::AssertHelper::operator=(local_a0,(Message *)local_58);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    if ((long *)local_98._0_8_ != local_88) {
      operator_delete((void *)local_98._0_8_,local_88[0] + 1);
    }
    if (((local_58[0] != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0'))
       && (local_58[0] != (long *)0x0)) {
      (**(code **)(*local_58[0] + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78 = (long *)0x1;
  local_58[0] = (long *)libcellml::Units::unitCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(1)","u->unitCount()",(unsigned_long *)&local_78,
             (unsigned_long *)local_58);
  if ((string)local_98.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_98.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_98.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x375,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_78 != (long *)0x0)) {
      (**(code **)(*local_78 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Units::removeAllUnits();
  local_78 = (long *)0x0;
  local_58[0] = (long *)libcellml::Units::unitCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,"size_t(0)","u->unitCount()",(unsigned_long *)&local_78,
             (unsigned_long *)local_58);
  if ((string)local_98.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_98.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_98.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x378,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_58,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_58);
    if (((local_78 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
       (local_78 != (long *)0x0)) {
      (**(code **)(*local_78 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_98.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  return;
}

Assistant:

TEST(Units, removeUnit)
{
    libcellml::UnitsPtr u = libcellml::Units::create();

    u->addUnit(libcellml::Units::StandardUnit::AMPERE, "micro");
    u->addUnit("kelvin");
    u->addUnit("siemens", "milli", -1.0);
    u->addUnit("metre", "1.7e10");

    EXPECT_EQ(size_t(4), u->unitCount());
    EXPECT_TRUE(u->removeUnit("siemens"));
    EXPECT_TRUE(u->removeUnit(libcellml::Units::StandardUnit::KELVIN));
    EXPECT_TRUE(u->removeUnit(1));
    EXPECT_EQ(size_t(1), u->unitCount());

    // Remove non-existent unit
    EXPECT_FALSE(u->removeUnit("gram"));
    EXPECT_FALSE(u->removeUnit(libcellml::Units::StandardUnit::BECQUEREL));
    EXPECT_FALSE(u->removeUnit(3));
    EXPECT_EQ(size_t(1), u->unitCount());

    u->removeAllUnits();
    EXPECT_EQ(size_t(0), u->unitCount());
}